

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O3

bool __thiscall ParsedH266TrackData::spsppsExists(ParsedH266TrackData *this,uint8_t *buff,int size)

{
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint32_t *cur32;
  uint32_t *puVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  
  uVar3 = (ulong)(this->super_ParsedH264TrackData).m_nalSize;
  if (buff < buff + ((long)size - uVar3)) {
    bVar5 = 0;
    bVar7 = 0;
    bVar8 = 0;
    puVar4 = (uint32_t *)buff;
    do {
      if ((char)uVar3 == '\x04') {
        uVar2 = my_ntohl(*puVar4);
        uVar3 = (ulong)(this->super_ParsedH264TrackData).m_nalSize;
      }
      else {
        uVar2 = (uint)*(byte *)((long)puVar4 + 2) |
                (uint)*(byte *)((long)puVar4 + 1) << 8 | (uint)(byte)*puVar4 << 0x10;
      }
      bVar1 = *(byte *)(uVar3 + 1 + (long)puVar4) >> 3;
      if (bVar1 == 0xe) {
        bVar5 = 1;
      }
      else if (bVar1 == 0x10) {
        bVar7 = 1;
      }
      else if (bVar1 == 0xf) {
        bVar8 = 1;
      }
      puVar4 = (uint32_t *)((long)puVar4 + (ulong)(uVar2 + (int)uVar3));
    } while (puVar4 < buff + ((long)size - uVar3));
    bVar6 = (bool)(bVar5 & bVar8 & bVar7);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ParsedH266TrackData::spsppsExists(uint8_t* buff, const int size)
{
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    bool vpsFound = false;
    bool spsFound = false;
    bool ppsFound = false;
    while (curPos < end - m_nalSize)
    {
        uint32_t elSize;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        const auto nalUnitType = static_cast<VvcUnit::NalType>(curPos[m_nalSize + 1] >> 3);
        if (nalUnitType == VvcUnit::NalType::VPS)
            vpsFound = true;
        else if (nalUnitType == VvcUnit::NalType::SPS)
            spsFound = true;
        else if (nalUnitType == VvcUnit::NalType::PPS)
            ppsFound = true;
        curPos += elSize + m_nalSize;
    }
    return vpsFound && spsFound && ppsFound;
}